

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_get_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  byte bVar1;
  Curl_easy *data;
  void *pvVar2;
  long lVar3;
  CURLcode CVar4;
  char *pcVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  char *pcVar8;
  long lVar9;
  _Bool connected;
  _Bool local_39;
  connectdata *local_38;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
    if ((instate == FTP_LIST) ||
       (((data->set).prefer_ascii != false || (0 < *(long *)((long)pvVar2 + 0x20))))) {
      lVar9 = -1;
      if (-1 < *(long *)((long)pvVar2 + 0x20)) {
        lVar9 = *(long *)((long)pvVar2 + 0x20);
      }
    }
    else {
      pcVar8 = (data->state).buffer;
      pcVar5 = strstr(pcVar8," bytes");
      lVar9 = -1;
      if (pcVar5 != (char *)0x0) {
        pbVar7 = (byte *)(pcVar5 + -1);
        local_38 = conn;
        if (pbVar7 + ~(ulong)pcVar8 != (byte *)0x0) {
          pcVar8 = pcVar8 + (2 - (long)pcVar5);
          do {
            bVar1 = *pbVar7;
            if ((ulong)bVar1 == 0x28) break;
            ppuVar6 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
              pbVar7 = (byte *)0x0;
              break;
            }
            pbVar7 = pbVar7 + -1;
            pcVar8 = pcVar8 + 1;
          } while (pcVar8 != (char *)0x0);
        }
        conn = local_38;
        if (pbVar7 != (byte *)0x0) {
          lVar9 = strtol((char *)(pbVar7 + 1),(char **)0x0,0);
        }
      }
    }
    lVar3 = (data->req).maxdownload;
    if (lVar3 < 1 || lVar9 <= lVar3) {
      if ((instate != FTP_LIST) && ((data->set).prefer_ascii != false)) {
        lVar9 = -1;
      }
    }
    else {
      (data->req).size = lVar3;
      lVar9 = lVar3;
    }
    Curl_infof(data,"Maxdownload = %ld\n");
    if (instate != FTP_LIST) {
      Curl_infof(data,"Getting file with size: %ld\n",lVar9);
    }
    (conn->proto).ftpc.state_saved = instate;
    (conn->proto).ftpc.retr_size_saved = lVar9;
    if ((data->set).ftp_use_port != true) {
      CVar4 = InitiateTransfer(conn);
      return CVar4;
    }
    CVar4 = AllowServerConnect(conn,&local_39);
    if ((CVar4 == CURLE_OK) && (local_39 == false)) {
      Curl_infof(data,"Data conn was not available immediately\n");
      (conn->proto).ftpc.state = FTP_STOP;
      (conn->proto).ftpc.wait_data_conn = true;
    }
  }
  else if (ftpcode == 0x1c2 && instate == FTP_LIST) {
    *(undefined4 *)((long)pvVar2 + 0x18) = 2;
    (conn->proto).ftpc.state = FTP_STOP;
    CVar4 = CURLE_OK;
  }
  else {
    Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
    CVar4 = CURLE_FTP_COULDNT_RETR_FILE;
    if (ftpcode == 0x226 && instate == FTP_RETR) {
      CVar4 = CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_get_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size=-1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->set.prefer_ascii &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      char *buf = data->state.buffer;
      bytes=strstr(buf, " bytes");
      if(bytes--) {
        long in=(long)(bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes=NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes++) {
          /* get the number! */
          size = curlx_strtoofft(bytes, NULL, 0);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->set.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T "\n",
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T "\n",
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(conn, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately\n");
        state(conn, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(conn);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = FTPTRANSFER_NONE; /* don't download anything */
      state(conn, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}